

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O2

bool __thiscall bssl::SSL_apply_handoff(bssl *this,SSL *ssl,Span<const_unsigned_char> handoff)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  BUF_MEM *__p;
  Span<const_unsigned_char> in;
  CBS seq;
  uint64_t handoff_version;
  CBS hs_buf;
  CBS transcript;
  CBS handoff_cbs;
  
  bVar3 = uses_disallowed_feature((SSL *)this);
  if ((!bVar3) &&
     (handoff_cbs.data = (uint8_t *)ssl, handoff_cbs.len = (size_t)handoff.data_,
     iVar4 = CBS_get_asn1(&handoff_cbs,&seq,0x20000010), iVar4 != 0)) {
    iVar4 = CBS_get_asn1_uint64(&seq,&handoff_version);
    if (iVar4 == 0) {
      return false;
    }
    if (handoff_version != 0) {
      return false;
    }
    iVar4 = CBS_get_asn1(&seq,&transcript,4);
    if (((iVar4 != 0) && (iVar4 = CBS_get_asn1(&seq,&hs_buf,4), iVar4 != 0)) &&
       (bVar3 = apply_remote_features((SSL *)this,&seq), bVar3)) {
      SSL_set_accept_state((SSL *)this);
      lVar2 = *(long *)(this + 0x30);
      *(ushort *)(lVar2 + 0xdc) = *(ushort *)(lVar2 + 0xdc) | 10;
      __p = BUF_MEM_new();
      std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)(lVar2 + 0xe0),(pointer)__p
                );
      if ((*(BUF_MEM **)(lVar2 + 0xe0) != (BUF_MEM *)0x0) &&
         (iVar4 = BUF_MEM_append(*(BUF_MEM **)(lVar2 + 0xe0),hs_buf.data,hs_buf.len), iVar4 != 0)) {
        if (transcript.len != 0) {
          in.size_ = transcript.len;
          in.data_ = transcript.data;
          SSLTranscript::Update((SSLTranscript *)(*(long *)(lVar2 + 0x118) + 0x208),in);
          *(byte *)(lVar2 + 0xdc) = *(byte *)(lVar2 + 0xdc) | 4;
        }
        puVar1 = (uint *)(*(long *)(lVar2 + 0x118) + 0x6c8);
        *puVar1 = *puVar1 | 0x80000;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SSL_apply_handoff(SSL *ssl, Span<const uint8_t> handoff) {
  if (uses_disallowed_feature(ssl)) {
    return false;
  }

  CBS seq, handoff_cbs(handoff);
  uint64_t handoff_version;
  if (!CBS_get_asn1(&handoff_cbs, &seq, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&seq, &handoff_version) ||
      handoff_version != kHandoffVersion) {
    return false;
  }

  CBS transcript, hs_buf;
  if (!CBS_get_asn1(&seq, &transcript, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1(&seq, &hs_buf, CBS_ASN1_OCTETSTRING) ||
      !apply_remote_features(ssl, &seq)) {
    return false;
  }

  SSL_set_accept_state(ssl);

  SSL3_STATE *const s3 = ssl->s3;
  s3->v2_hello_done = true;
  s3->has_message = true;

  s3->hs_buf.reset(BUF_MEM_new());
  if (!s3->hs_buf ||
      !BUF_MEM_append(s3->hs_buf.get(), CBS_data(&hs_buf), CBS_len(&hs_buf))) {
    return false;
  }

  if (CBS_len(&transcript) != 0) {
    s3->hs->transcript.Update(transcript);
    s3->is_v2_hello = true;
  }
  s3->hs->handback = true;

  return true;
}